

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O1

ON_Brep * __thiscall ON_BrepRegion::RegionBoundaryBrep(ON_BrepRegion *this,ON_Brep *brep)

{
  ON_BrepRegionTopology *pOVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  ON_Brep *pOVar5;
  ulong uVar6;
  bool *pbVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  bool bHasBoundary;
  bool bIsOriented;
  ON_SimpleArray<int> subfi;
  ON_SimpleArray<const_ON_BrepFaceSide_*> FS;
  ON_Workspace ws;
  bool local_79;
  ON_BrepFaceSide *local_78;
  ON_SimpleArray<int> local_70;
  ON_SimpleArray<const_ON_BrepFaceSide_*> local_58;
  ON_Workspace local_40;
  
  ON_Workspace::ON_Workspace(&local_40);
  if ((((this->m_rtop == (ON_BrepRegionTopology *)0x0) ||
       (pOVar5 = this->m_rtop->m_brep, pOVar5 == (ON_Brep *)0x0 || pOVar5 == brep)) ||
      ((pOVar5->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count < 1)
      ) || (sVar8 = (size_t)(this->m_fsi).m_count, (long)sVar8 < 1)) {
    pOVar5 = (ON_Brep *)0x0;
    goto LAB_00411c2f;
  }
  local_58._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c798;
  local_58.m_a = (ON_BrepFaceSide **)0x0;
  local_58.m_count = 0;
  local_58.m_capacity = 0;
  ON_SimpleArray<const_ON_BrepFaceSide_*>::SetCapacity(&local_58,sVar8);
  sVar8 = (size_t)(this->m_fsi).m_count;
  local_70._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
  local_70.m_a = (int *)0x0;
  local_70.m_count = 0;
  local_70.m_capacity = 0;
  if (sVar8 != 0) {
    ON_SimpleArray<int>::SetCapacity(&local_70,sVar8);
  }
  if (0 < (this->m_fsi).m_count) {
    lVar10 = 0;
    do {
      pOVar1 = this->m_rtop;
      if (pOVar1 == (ON_BrepRegionTopology *)0x0) {
LAB_00411ae7:
        local_78 = (ON_BrepFaceSide *)0x0;
      }
      else {
        local_78 = (ON_BrepFaceSide *)0x0;
        if (lVar10 < (this->m_fsi).m_count) {
          iVar4 = (this->m_fsi).m_a[lVar10];
          if (((long)iVar4 < 0) ||
             ((pOVar1->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.
              super_ON_ClassArray<ON_BrepFaceSide>.m_count <= iVar4)) goto LAB_00411ae7;
          local_78 = (pOVar1->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.
                     super_ON_ClassArray<ON_BrepFaceSide>.m_a + iVar4;
        }
      }
      bVar3 = true;
      if (((local_78 != (ON_BrepFaceSide *)0x0) && (iVar4 = local_78->m_fi, -1 < iVar4)) &&
         (iVar4 < (pOVar5->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                  m_count)) {
        uVar6 = (ulong)local_58.m_count;
        bVar11 = 0 < (long)uVar6;
        if (0 < (long)uVar6) {
          if (iVar4 != (*local_58.m_a)->m_fi) {
            uVar9 = 0;
            do {
              if (uVar6 - 1 == uVar9) goto LAB_00411b4f;
              lVar2 = uVar9 + 1;
              uVar9 = uVar9 + 1;
            } while (iVar4 != local_58.m_a[lVar2]->m_fi);
            bVar11 = uVar9 < uVar6;
          }
          bVar3 = false;
          if (bVar11) goto LAB_00411b72;
        }
LAB_00411b4f:
        ON_SimpleArray<const_ON_BrepFaceSide_*>::Append(&local_58,&local_78);
        bVar3 = false;
        ON_SimpleArray<int>::Append(&local_70,&local_78->m_fi);
      }
LAB_00411b72:
      if (bVar3) goto LAB_00411c4b;
      lVar10 = lVar10 + 1;
    } while (lVar10 < (this->m_fsi).m_count);
  }
  pOVar5 = ON_Brep::SubBrep(pOVar5,local_70.m_count,local_70.m_a,brep);
  if (pOVar5 == (ON_Brep *)0x0) {
LAB_00411c4b:
    pOVar5 = (ON_Brep *)0x0;
  }
  else {
    if ((pOVar5->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count !=
        local_58.m_count) goto LAB_00411c4b;
    if (0 < local_58.m_count) {
      pbVar7 = &((pOVar5->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                m_a)->m_bRev;
      uVar6 = 0;
      do {
        *pbVar7 = SUB41((uint)local_58.m_a[uVar6]->m_srf_dir >> 0x1f,0);
        uVar6 = uVar6 + 1;
        pbVar7 = pbVar7 + 0xd8;
      } while ((local_58._16_8_ & 0xffffffff) != uVar6);
    }
    local_78 = (ON_BrepFaceSide *)((ulong)local_78 & 0xffffffffffffff00);
    local_79 = true;
    bVar3 = ON_Brep::IsManifold(pOVar5,(bool *)&local_78,&local_79);
    if (((bVar3) && ((char)local_78 == '\x01')) && (local_79 == false)) {
      if (this->m_type == 0) {
        iVar4 = 1;
      }
      else {
        iVar4 = 2;
        if (this->m_type != 1) goto LAB_00411c4e;
      }
      pOVar5->m_is_solid = iVar4;
    }
  }
LAB_00411c4e:
  ON_SimpleArray<int>::~ON_SimpleArray(&local_70);
  ON_SimpleArray<const_ON_BrepFaceSide_*>::~ON_SimpleArray(&local_58);
LAB_00411c2f:
  ON_Workspace::~ON_Workspace(&local_40);
  return pOVar5;
}

Assistant:

ON_Brep* ON_BrepRegion::RegionBoundaryBrep( ON_Brep* brep ) const
{
  ON_Workspace ws;
  if ( 0 == m_rtop )
    return 0;

  const ON_Brep* rtop_brep = m_rtop->Brep();

  if ( rtop_brep == brep || 0 == rtop_brep || rtop_brep->m_F.Count() <= 0 || m_fsi.Count() <= 0 )
    return 0;

  ON_SimpleArray<const ON_BrepFaceSide*> FS(m_fsi.Count());
  ON_SimpleArray<int> subfi(m_fsi.Count());

  int rfsi, i;
  for ( rfsi = 0; rfsi < m_fsi.Count(); rfsi++ )
  {
    const ON_BrepFaceSide* fs = FaceSide(rfsi);
    if ( 0 == fs || fs->m_fi < 0 || fs->m_fi >= rtop_brep->m_F.Count() )
      return 0;
    for ( i = 0; i < FS.Count(); i++ )
    {
      if ( fs->m_fi == FS[i]->m_fi )
        break;
    }
    if ( i < FS.Count() )
      continue;
    FS.Append(fs);
    subfi.Append(fs->m_fi);
  }

  brep = rtop_brep->SubBrep(subfi.Count(),subfi.Array(),brep);
  if ( !brep )
    return 0;
  if ( brep->m_F.Count() != FS.Count() )
    return 0;
  for ( i = 0; i < FS.Count(); i++ )
  {
    ON_BrepFace& face = brep->m_F[i];
    face.m_bRev = ( FS[i]->m_srf_dir < 0 );
  }

  bool bIsOriented = false;
  bool bHasBoundary = true;
  if ( brep->IsManifold(&bIsOriented,&bHasBoundary) )
  {
    if ( bIsOriented && !bHasBoundary )
    {
      if ( 1 == m_type )
        brep->m_is_solid = 2;
      else if ( 0 == m_type )
        brep->m_is_solid = 1;
    }
  }

  return brep;
}